

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_quit(Curl_easy *data,connectdata *conn)

{
  CURLcode error;
  char *pcVar1;
  CURLcode local_24;
  CURLcode result;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  local_24 = CURLE_OK;
  if (((conn->proto).ftpc.ctl_valid & 1U) != 0) {
    error = Curl_pp_sendf(data,&(conn->proto).ftpc.pp,"%s","QUIT");
    if (error != CURLE_OK) {
      pcVar1 = curl_easy_strerror(error);
      Curl_failf(data,"Failure sending QUIT command: %s",pcVar1);
      (conn->proto).ftpc.ctl_valid = false;
      Curl_conncontrol(conn,1);
      _state(data,FTP_STOP);
      return error;
    }
    _state(data,FTP_QUIT);
    local_24 = ftp_block_statemach(data,conn);
  }
  return local_24;
}

Assistant:

static CURLcode ftp_quit(struct Curl_easy *data, struct connectdata *conn)
{
  CURLcode result = CURLE_OK;

  if(conn->proto.ftpc.ctl_valid) {
    result = Curl_pp_sendf(data, &conn->proto.ftpc.pp, "%s", "QUIT");
    if(result) {
      failf(data, "Failure sending QUIT command: %s",
            curl_easy_strerror(result));
      conn->proto.ftpc.ctl_valid = FALSE; /* mark control connection as bad */
      connclose(conn, "QUIT command failed"); /* mark for connection closure */
      state(data, FTP_STOP);
      return result;
    }

    state(data, FTP_QUIT);

    result = ftp_block_statemach(data, conn);
  }

  return result;
}